

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc.h
# Opt level: O0

void foreach_overlappable_nb_left
               (AV1_COMMON *cm,MACROBLOCKD *xd,int nb_max,overlappable_nb_visitor_t fun,
               void *fun_ctxt)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  code *in_RCX;
  int in_EDX;
  uint *in_RSI;
  AV1_COMMON *in_RDI;
  undefined8 in_R8;
  MB_MODE_INFO **left_mi;
  int left_mi_row;
  uint8_t mi_step;
  int end_row;
  MB_MODE_INFO **prev_col_mi;
  int mi_row;
  int nb_count;
  int num_planes;
  int local_5c;
  undefined8 *local_58;
  uint local_4c;
  byte local_45;
  int local_30;
  
  if ((*(byte *)((long)in_RSI + 0x1ec1) & 1) != 0) {
    iVar3 = av1_num_planes(in_RDI);
    local_30 = 0;
    uVar1 = *in_RSI;
    lVar5 = *(long *)(in_RSI + 0x7ae) + -8 + (long)(int)(uVar1 * in_RSI[2]) * -8;
    local_4c = uVar1;
    if ((int)(uVar1 + *(byte *)((long)in_RSI + 0x2075)) < (in_RDI->mi_params).mi_rows) {
      local_5c = uVar1 + *(byte *)((long)in_RSI + 0x2075);
    }
    else {
      local_5c = (in_RDI->mi_params).mi_rows;
    }
    for (; (int)local_4c < local_5c && local_30 < in_EDX; local_4c = local_45 + local_4c) {
      local_58 = (undefined8 *)(lVar5 + (long)(int)(local_4c * in_RSI[2]) * 8);
      if ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [*(byte *)*local_58] < 0x10) {
        local_45 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [*(byte *)*local_58];
      }
      else {
        local_45 = 0x10;
      }
      if (local_45 == 1) {
        local_4c = local_4c & 0xfffffffe;
        local_58 = (undefined8 *)(lVar5 + (long)(int)((local_4c + 1) * in_RSI[2]) * 8);
        local_45 = 2;
      }
      iVar4 = is_neighbor_overlappable((MB_MODE_INFO *)0x6c9ae3);
      if (iVar4 != 0) {
        local_30 = local_30 + 1;
        bVar2 = local_45;
        if (*(byte *)((long)in_RSI + 0x2075) < local_45) {
          bVar2 = *(byte *)((long)in_RSI + 0x2075);
        }
        (*in_RCX)(in_RSI,local_4c - uVar1,0,bVar2,1,*local_58,in_R8,iVar3);
      }
    }
  }
  return;
}

Assistant:

static inline void foreach_overlappable_nb_left(const AV1_COMMON *cm,
                                                MACROBLOCKD *xd, int nb_max,
                                                overlappable_nb_visitor_t fun,
                                                void *fun_ctxt) {
  if (!xd->left_available) return;

  const int num_planes = av1_num_planes(cm);
  int nb_count = 0;
  // prev_col_mi points into the mi array, starting at the top of the
  // previous column
  const int mi_row = xd->mi_row;
  MB_MODE_INFO **prev_col_mi = xd->mi - 1 - mi_row * xd->mi_stride;
  const int end_row = AOMMIN(mi_row + xd->height, cm->mi_params.mi_rows);
  uint8_t mi_step;
  for (int left_mi_row = mi_row; left_mi_row < end_row && nb_count < nb_max;
       left_mi_row += mi_step) {
    MB_MODE_INFO **left_mi = prev_col_mi + left_mi_row * xd->mi_stride;
    mi_step =
        AOMMIN(mi_size_high[left_mi[0]->bsize], mi_size_high[BLOCK_64X64]);
    if (mi_step == 1) {
      left_mi_row &= ~1;
      left_mi = prev_col_mi + (left_mi_row + 1) * xd->mi_stride;
      mi_step = 2;
    }
    if (is_neighbor_overlappable(*left_mi)) {
      ++nb_count;
      fun(xd, left_mi_row - mi_row, 0, AOMMIN(xd->height, mi_step), 1, *left_mi,
          fun_ctxt, num_planes);
    }
  }
}